

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie.cpp
# Opt level: O3

UBool utrie_set32_63(UNewTrie *trie,UChar32 c,uint32_t value)

{
  UBool UVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  uint32_t *puVar5;
  uint32_t *puVar6;
  
  if (trie == (UNewTrie *)0x0) {
    return '\0';
  }
  UVar1 = '\0';
  if (((uint)c < 0x110000) && (trie->isCompacted == '\0')) {
    uVar2 = trie->index[(uint)c >> 5];
    lVar3 = (long)(int)uVar2;
    if (lVar3 < 1) {
      uVar2 = trie->dataLength;
      if (trie->dataCapacity < (int)(uVar2 + 0x20)) {
        return '\0';
      }
      trie->dataLength = uVar2 + 0x20;
      if ((int)uVar2 < 0) {
        return '\0';
      }
      trie->index[(uint)c >> 5] = uVar2;
      puVar5 = trie->data + -lVar3;
      puVar6 = trie->data + uVar2;
      for (lVar4 = 0x20; lVar4 != 0; lVar4 = lVar4 + -1) {
        *puVar6 = *puVar5;
        puVar5 = puVar5 + 1;
        puVar6 = puVar6 + 1;
      }
    }
    trie->data[(c & 0x1fU) + uVar2] = value;
    UVar1 = '\x01';
  }
  return UVar1;
}

Assistant:

U_CAPI UBool U_EXPORT2
utrie_set32(UNewTrie *trie, UChar32 c, uint32_t value) {
    int32_t block;

    /* valid, uncompacted trie and valid c? */
    if(trie==NULL || trie->isCompacted || (uint32_t)c>0x10ffff) {
        return FALSE;
    }

    block=utrie_getDataBlock(trie, c);
    if(block<0) {
        return FALSE;
    }

    trie->data[block+(c&UTRIE_MASK)]=value;
    return TRUE;
}